

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

bool ImgfsFile::isimgfsheader(ReadWriter_ptr *rd,uint64_t ofs)

{
  element_type *peVar1;
  char *pcVar2;
  value_type_conflict2 *__val;
  undefined1 auVar3 [16];
  
  (*((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_ReadWriter[4])
            ();
  pcVar2 = (char *)operator_new(0x10);
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  pcVar2[8] = '\0';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  pcVar2[0xc] = '\0';
  pcVar2[0xd] = '\0';
  pcVar2[0xe] = '\0';
  pcVar2[0xf] = '\0';
  peVar1 = (rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_ReadWriter[2])(peVar1,pcVar2,0x10);
  auVar3[0] = -(*pcVar2 == -8);
  auVar3[1] = -(pcVar2[1] == -0x54);
  auVar3[2] = -(pcVar2[2] == ',');
  auVar3[3] = -(pcVar2[3] == -99);
  auVar3[4] = -(pcVar2[4] == -0x1d);
  auVar3[5] = -(pcVar2[5] == -0x2c);
  auVar3[6] = -(pcVar2[6] == '+');
  auVar3[7] = -(pcVar2[7] == 'M');
  auVar3[8] = -(pcVar2[8] == -0x43);
  auVar3[9] = -(pcVar2[9] == '0');
  auVar3[10] = -(pcVar2[10] == -0x6f);
  auVar3[0xb] = -(pcVar2[0xb] == 'n');
  auVar3[0xc] = -(pcVar2[0xc] == -0x28);
  auVar3[0xd] = -(pcVar2[0xd] == 'O');
  auVar3[0xe] = -(pcVar2[0xe] == '1');
  auVar3[0xf] = -(pcVar2[0xf] == -0x24);
  operator_delete(pcVar2,0x10);
  return (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf)
         == 0xffff;
}

Assistant:

static bool isimgfsheader(ReadWriter_ptr rd, uint64_t ofs)
    {
        const uint8_t imgfsuuid[16]= {
            0xf8, 0xac, 0x2c, 0x9d, 0xe3, 0xd4, 0x2b, 0x4d, 0xbd, 0x30, 0x91, 0x6e, 0xd8, 0x4f, 0x31, 0xdc
        };
        rd->setpos(ofs);
        ByteVector sig(16);
        rd->read(&sig[0], sig.size());

        return std::equal(imgfsuuid, imgfsuuid+sizeof(imgfsuuid), &sig[0]);
    }